

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

StackScriptFunction * __thiscall
Js::InterpreterStackFrame::GetStackNestedFunction(InterpreterStackFrame *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint index_local;
  InterpreterStackFrame *this_local;
  
  uVar3 = ParseableFunctionInfo::GetNestedCount(*(ParseableFunctionInfo **)(this + 0x88));
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1e97,"(index < this->m_functionBody->GetNestedCount())",
                                "index < this->m_functionBody->GetNestedCount()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = ParseableFunctionInfo::DoStackNestedFunc(*(ParseableFunctionInfo **)(this + 0x88));
  if (bVar2) {
    this_local = (InterpreterStackFrame *)(*(long *)(this + 0x48) + (ulong)index * 0x50);
  }
  else {
    this_local = (InterpreterStackFrame *)0x0;
  }
  return (StackScriptFunction *)this_local;
}

Assistant:

StackScriptFunction * InterpreterStackFrame::GetStackNestedFunction(uint index)
    {
        Assert(index < this->m_functionBody->GetNestedCount());
        // Re-check if we have disable stack nested function
        if (this->m_functionBody->DoStackNestedFunc())
        {
            return this->stackNestedFunctions + index;
        }
        return nullptr;
    }